

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

bool __thiscall
flexbuffers::Verifier::VerifyVector(Verifier *this,Reference r,uint8_t *p,Type elem_type)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  BitWidth BVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  uint8_t *puVar13;
  byte bVar14;
  size_t len;
  Reference r_00;
  Reference r_01;
  size_t len_1;
  
  uVar7 = this->depth_ + 1;
  this->depth_ = uVar7;
  uVar5 = this->num_vectors_ + 1;
  this->num_vectors_ = uVar5;
  if (this->max_depth_ < uVar7) {
    return false;
  }
  if (this->max_vectors_ < uVar5) {
    return false;
  }
  bVar14 = r.byte_width_;
  uVar5 = r._8_8_ >> 8 & 0xff;
  if ((ulong)((long)p - (long)this->buf_) < uVar5) {
LAB_0015d2a4:
    bVar3 = false;
  }
  else {
    uVar7 = r._8_8_ >> 0x20;
    if (this->reuse_tracker_ != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      BVar4 = Builder::WidthB(uVar5);
      bVar9 = (char)r.type_ * '\x04' | (byte)BVar4;
      lVar8 = -(long)this->buf_ - uVar5;
      puVar1 = (this->reuse_tracker_->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (p[(long)(puVar1 + lVar8)] == bVar9) {
        return true;
      }
      if (p[(long)(puVar1 + lVar8)] != 0) goto LAB_0015d2a4;
      p[(long)(puVar1 + lVar8)] = bVar9;
    }
    lVar8 = -uVar5;
    if (bVar14 < 4) {
      if (bVar14 < 2) {
        uVar10 = (ulong)p[lVar8];
      }
      else {
        uVar10 = (ulong)*(ushort *)(p + lVar8);
      }
    }
    else if (bVar14 < 8) {
      uVar10 = (ulong)*(uint *)(p + lVar8);
    }
    else {
      uVar10 = *(ulong *)(p + lVar8);
    }
    bVar9 = bVar14;
    if (uVar7 == 0x19) {
      bVar9 = 1;
    }
    if (uVar7 == 5) {
      bVar9 = 1;
    }
    uVar7 = CONCAT71(0,bVar9);
    bVar3 = false;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar7;
    if (uVar10 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0)) {
      uVar6 = uVar10 * uVar7;
      uVar12 = this->size_;
      bVar3 = false;
      if ((uVar6 < uVar12) && ((ulong)((long)p - (long)this->buf_) <= uVar12 - uVar6)) {
        if (elem_type == FBT_KEY) {
          lVar8 = -uVar7;
          if (bVar9 < 4) {
            if (bVar9 < 2) {
              uVar5 = (ulong)p[lVar8];
            }
            else {
              uVar5 = (ulong)*(ushort *)(p + lVar8);
            }
          }
          else if (bVar9 < 8) {
            uVar5 = (ulong)*(uint *)(p + lVar8);
          }
          else {
            uVar5 = *(ulong *)(p + lVar8);
          }
          if (uVar10 != 0) {
            uVar12 = 0;
            do {
              puVar13 = (uint8_t *)0x0;
              if (uVar12 < uVar5) {
                puVar13 = p;
              }
              uVar6 = 0x101;
              if (uVar12 < uVar5) {
                uVar6 = uVar7 | 0x400000100;
              }
              r_00.parent_width_ = (char)uVar6;
              r_00.byte_width_ = (char)(uVar6 >> 8);
              r_00._10_2_ = (short)(uVar6 >> 0x10);
              r_00.type_ = (int)(uVar6 >> 0x20);
              r_00.data_ = puVar13;
              bVar3 = VerifyRef(this,r_00);
              if (!bVar3) {
                return false;
              }
              uVar12 = uVar12 + 1;
              p = p + uVar7;
            } while (uVar10 != uVar12);
          }
        }
        else if (elem_type == FBT_NULL) {
          if (uVar12 <= uVar10) {
            return false;
          }
          if ((uint8_t *)(uVar12 - uVar10) < p + (uVar6 - (long)this->buf_)) {
            return false;
          }
          if (bVar14 < 4) {
            if (bVar14 < 2) {
              uVar7 = uVar10 & 0xff;
            }
            else {
              uVar7 = (ulong)*(ushort *)(p + lVar8);
            }
          }
          else if (bVar14 < 8) {
            uVar7 = (ulong)*(uint *)(p + lVar8);
          }
          else {
            uVar7 = *(ulong *)(p + lVar8);
          }
          if (uVar10 != 0) {
            uVar12 = 0;
            puVar13 = p;
            do {
              if (uVar12 < uVar7) {
                uVar6 = (1L << (p[uVar12 + uVar7 * uVar5] & 3)) << 8 |
                        (ulong)(p[uVar12 + uVar7 * uVar5] >> 2) << 0x20 | uVar5;
                puVar11 = puVar13;
              }
              else {
                uVar6 = 0x101;
                puVar11 = (uint8_t *)0x0;
              }
              r_01.parent_width_ = (char)uVar6;
              r_01.byte_width_ = (char)(uVar6 >> 8);
              r_01._10_2_ = (short)(uVar6 >> 0x10);
              r_01.type_ = (int)(uVar6 >> 0x20);
              r_01.data_ = puVar11;
              bVar3 = VerifyRef(this,r_01);
              if (!bVar3) goto LAB_0015d2a4;
              uVar12 = uVar12 + 1;
              puVar13 = puVar13 + uVar5;
            } while (uVar10 != uVar12);
          }
        }
        else if (elem_type != FBT_BOOL && 3 < (int)elem_type) {
          __assert_fail("IsInline(elem_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                        ,0x71e,
                        "bool flexbuffers::Verifier::VerifyVector(Reference, const uint8_t *, Type)"
                       );
        }
        this->depth_ = this->depth_ - 1;
        bVar3 = true;
      }
    }
  }
  return bVar3;
}

Assistant:

bool VerifyVector(Reference r, const uint8_t *p, Type elem_type) {
    // Any kind of nesting goes thru this function, so guard against that
    // here, both with simple nesting checks, and the reuse tracker if on.
    depth_++;
    num_vectors_++;
    if (!Check(depth_ <= max_depth_ && num_vectors_ <= max_vectors_))
      return false;
    auto size_byte_width = r.byte_width_;
    if (!VerifyBeforePointer(p, size_byte_width)) return false;
    FLEX_CHECK_VERIFIED(p - size_byte_width,
                        PackedType(Builder::WidthB(size_byte_width), r.type_));
    auto sized = Sized(p, size_byte_width);
    auto num_elems = sized.size();
    auto elem_byte_width = r.type_ == FBT_STRING || r.type_ == FBT_BLOB
                               ? uint8_t(1)
                               : r.byte_width_;
    auto max_elems = SIZE_MAX / elem_byte_width;
    if (!Check(num_elems < max_elems))
      return false;  // Protect against byte_size overflowing.
    auto byte_size = num_elems * elem_byte_width;
    if (!VerifyFromPointer(p, byte_size)) return false;
    if (elem_type == FBT_NULL) {
      // Verify type bytes after the vector.
      if (!VerifyFromPointer(p + byte_size, num_elems)) return false;
      auto v = Vector(p, size_byte_width);
      for (size_t i = 0; i < num_elems; i++)
        if (!VerifyRef(v[i])) return false;
    } else if (elem_type == FBT_KEY) {
      auto v = TypedVector(p, elem_byte_width, FBT_KEY);
      for (size_t i = 0; i < num_elems; i++)
        if (!VerifyRef(v[i])) return false;
    } else {
      FLATBUFFERS_ASSERT(IsInline(elem_type));
    }
    depth_--;
    return true;
  }